

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gabby.cc
# Opt level: O3

void __thiscall GB::Trace(GB *this)

{
  byte bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  char temp [64];
  
  if ((this->s).op_tick != 0) {
    return;
  }
  if (((this->s).tick & 1) == 0) {
    bVar1 = (this->s).field_2.field_0.f;
    uVar3 = 0x7a;
    if (-1 < (char)bVar1) {
      uVar3 = 0x2d;
    }
    uVar2 = 0x6e;
    if ((bVar1 & 0x40) == 0) {
      uVar2 = 0x2d;
    }
    uVar4 = 0x68;
    if ((bVar1 & 0x20) == 0) {
      uVar4 = 0x2d;
    }
    uVar5 = 99;
    if ((bVar1 & 0x10) == 0) {
      uVar5 = 0x2d;
    }
    printf("a:%02x f:%c%c%c%c bc:%04x de:%04x hl:%04x sp:%04x pc:%04x",
           (ulong)(this->s).field_2.field_0.a,uVar3,uVar2,uVar4,uVar5,(ulong)(this->s).field_3.bc,
           (ulong)(this->s).field_4.de,(ulong)(this->s).field_5.hl,(ulong)(this->s).sp,
           (ulong)(this->s).pc);
    printf(" (cy: %.f)",(double)(this->s).tick * 0.5);
    printf(" ppu:%c%u",(ulong)((uint)(-1 < (char)(this->s).io[0x40]) * 2 + 0x2b),
           (ulong)((this->s).io[0x41] & 3));
    printf(" LY:%u",(ulong)(this->s).io[0x44]);
    printf(" |");
    Disassemble(this,(this->s).pc,temp,0x40);
    printf("%s",temp);
    putchar(10);
  }
  return;
}

Assistant:

void GB::Trace() {
  if (s.op_tick == 0 && (s.tick & 1) == 0) {
    printf("a:%02x f:%c%c%c%c bc:%04x de:%04x hl:%04x sp:%04x pc:%04x", s.a,
           (s.f & FZ) ? 'z' : '-', (s.f & FN) ? 'n' : '-',
           (s.f & FH) ? 'h' : '-', (s.f & FC) ? 'c' : '-', s.bc, s.de, s.hl,
           s.sp, s.pc);
    printf(" (cy: %.f)", clocks());
    printf(" ppu:%c%u", s.io[LCDC] & 0x80 ? '+' : '-', s.io[STAT] & 3);
    printf(" LY:%u", s.io[LY]);
    printf(" |");
    PrintInstruction(s.pc);
    printf("\n");
  }
}